

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O1

EStatusCode __thiscall
PDFWriter::StartPDFForStream
          (PDFWriter *this,IByteWriterWithPosition *inOutputStream,EPDFVersion inPDFVersion,
          LogConfiguration *inLogConfiguration,PDFCreationSettings *inPDFCreationSettings)

{
  bool bVar1;
  EStatusCode EVar2;
  EPDFVersion inPDFVersion_00;
  
  inPDFVersion_00 = inPDFCreationSettings->WriteXrefAsXrefStream | ePDFVersion14;
  if (inPDFVersion != ePDFVersionUndefined) {
    inPDFVersion_00 = inPDFVersion;
  }
  SetupLog(this,inLogConfiguration);
  SetupCreationSettings(this,inPDFCreationSettings);
  if ((inPDFCreationSettings->DocumentEncryptionOptions).ShouldEncrypt == true) {
    PDFHummus::DocumentContext::SetupEncryption
              (&this->mDocumentContext,&inPDFCreationSettings->DocumentEncryptionOptions,
               inPDFVersion_00);
    bVar1 = PDFHummus::DocumentContext::SupportsEncryption(&this->mDocumentContext);
    if (!bVar1) {
      return eFailure;
    }
  }
  ObjectsContext::SetOutputStream(&this->mObjectsContext,inOutputStream);
  this->mIsModified = false;
  EVar2 = PDFHummus::DocumentContext::WriteHeader(&this->mDocumentContext,inPDFVersion_00);
  return EVar2;
}

Assistant:

EStatusCode PDFWriter::StartPDFForStream(IByteWriterWithPosition* inOutputStream,
										 EPDFVersion inPDFVersion,
										 const LogConfiguration& inLogConfiguration,
										 const PDFCreationSettings& inPDFCreationSettings)
{
	EPDFVersion pdfVersion = thisOrDefaultVersion(inPDFVersion, inPDFCreationSettings.WriteXrefAsXrefStream);
	SetupLog(inLogConfiguration);
	SetupCreationSettings(inPDFCreationSettings);
	if (inPDFCreationSettings.DocumentEncryptionOptions.ShouldEncrypt) {
		mDocumentContext.SetupEncryption(inPDFCreationSettings.DocumentEncryptionOptions, pdfVersion);
		if (!mDocumentContext.SupportsEncryption())
			return eFailure;
	}

	mObjectsContext.SetOutputStream(inOutputStream);
    mIsModified = false;

	return mDocumentContext.WriteHeader(pdfVersion);
}